

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SpawnProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *origin;
  PClassActor *type;
  DAngle DVar1;
  DAngle DVar2;
  bool bVar3;
  uint uVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  TAngle<double> *other;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_1a0;
  bool local_176;
  bool local_173;
  TFlags<ActorFlag3,_unsigned_int> local_170;
  TFlags<ActorFlag4,_unsigned_int> local_16c;
  TFlags<ActorFlag2,_unsigned_int> local_168;
  TFlags<ActorFlag2,_unsigned_int> local_164;
  TFlags<ActorFlag2,_unsigned_int> local_160;
  TFlags<ActorFlag2,_unsigned_int> local_15c;
  AActor *local_158;
  AActor *owner;
  TAngle<double> local_148;
  double local_138;
  double missilespeed;
  DVector3 local_128;
  DVector3 local_110;
  DVector3 local_f8;
  DVector3 local_e0;
  undefined1 local_c8 [8];
  DVector3 pos;
  double z;
  double y;
  double x;
  DAngle angle;
  AActor *missile;
  AActor *targ;
  int aimmode;
  AActor *ref;
  int ptr;
  DAngle Pitch;
  int flags;
  DAngle Angle;
  double Spawnofs_xy;
  double Spawnheight;
  MetaClass *ti;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar7 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar7 = true, (param->field_0).field_1.atag != 1)) {
    bVar7 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar7) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  local_173 = true;
  if (origin != (AActor *)0x0) {
    local_173 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
  }
  if (local_173 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b7,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar7 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar7 = true, param[1].field_0.field_1.atag != 1)) {
    bVar7 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar7) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  local_176 = true;
  if (type != (PClassActor *)0x0) {
    local_176 = PClass::IsDescendantOf((PClass *)type,AActor::RegistrationInfo.MyClass);
  }
  if (local_176 == false) {
    __assert_fail("ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x5b8,
                  "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 3) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5b9,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    Spawnofs_xy = (pVVar5->field_0).f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5b9,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    Spawnofs_xy = param[2].field_0.f;
  }
  if (numparam < 4) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5ba,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    Angle.Degrees = (double)(pVVar5->field_0).field_1.a;
  }
  else {
    if (param[3].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5ba,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    Angle.Degrees = (double)param[3].field_0.field_1.a;
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa8);
  if (numparam < 5) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bb,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa8,(pVVar5->field_0).f);
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bb,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa8,param[4].field_0.f);
  }
  if (numparam < 6) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar5->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bc,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    Pitch.Degrees._4_4_ = (pVVar5->field_0).i;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bc,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    Pitch.Degrees._4_4_ = param[5].field_0.i;
  }
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff98);
  if (numparam < 7) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bd,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff98,(pVVar5->field_0).f);
  }
  else {
    if (param[6].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5bd,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff98,param[6].field_0.f);
  }
  if (numparam < 8) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    if ((pVVar5->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5be,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    ref._4_4_ = (pVVar5->field_0).i;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x5be,
                    "int AF_AActor_A_SpawnProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    ref._4_4_ = param[7].field_0.i;
  }
  pAVar6 = COPY_AAPTR(origin,ref._4_4_);
  uVar4 = Pitch.Degrees._4_4_ & 3;
  if ((pAVar6 == (AActor *)0x0) && (uVar4 != 2)) {
    if ((Pitch.Degrees._4_4_ & 8) == 0) {
      return 0;
    }
    bVar7 = false;
    if ((origin->SeeState != (FState *)0x0) && (bVar7 = true, origin->health < 1)) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_170,
                 (int)origin + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_170);
      bVar7 = uVar4 == 0;
    }
    if (!bVar7) {
      return 0;
    }
    AActor::SetState(origin,origin->SeeState,false);
    return 0;
  }
  if (type == (PClassActor *)0x0) {
    return 0;
  }
  TAngle<double>::operator-((TAngle<double> *)&x,90.0);
  DVar1 = Angle;
  dVar8 = TAngle<double>::Cos((TAngle<double> *)&x);
  DVar2 = Angle;
  dVar8 = DVar1.Degrees * dVar8;
  dVar9 = TAngle<double>::Sin((TAngle<double> *)&x);
  dVar9 = DVar2.Degrees * dVar9;
  dVar10 = AActor::GetBobOffset(origin,0.0);
  if (origin->player == (player_t *)0x0) {
    local_1a0 = 0.0;
  }
  else {
    local_1a0 = origin->player->crouchoffset;
  }
  pos.Z = ((Spawnofs_xy + dVar10) - 32.0) + local_1a0;
  AActor::Pos((DVector3 *)local_c8,origin);
  if (uVar4 != 0) {
    if (uVar4 == 1) {
      dVar10 = AActor::GetBobOffset(origin,0.0);
      AActor::Vec3Offset(&local_110,origin,dVar8,dVar9,dVar10 + Spawnofs_xy,false);
      angle.Degrees = (double)P_SpawnMissileXYZ(&local_110,origin,pAVar6,type,false,(AActor *)0x0);
      goto LAB_0050dd4c;
    }
    if (uVar4 == 2) {
      AActor::Vec3Offset(&local_128,origin,dVar8,dVar9,0.0,false);
      AActor::SetXYZ(origin,&local_128);
      dVar8 = AActor::Z(origin);
      dVar9 = AActor::GetBobOffset(origin,0.0);
      TAngle<double>::TAngle((TAngle<double> *)&missilespeed,&(origin->Angles).Yaw);
      pAVar6 = GetDefaultByType((PClass *)type);
      angle.Degrees =
           (double)P_SpawnMissileAngleZSpeed
                             (origin,dVar8 + dVar9 + Spawnofs_xy,type,(DAngle *)&missilespeed,0.0,
                              pAVar6->Speed,origin,false);
      AActor::SetXYZ(origin,(DVector3 *)local_c8);
      Pitch.Degrees._4_4_ = Pitch.Degrees._4_4_ | 0x10;
      goto LAB_0050dd4c;
    }
  }
  AActor::Vec3Offset(&local_e0,origin,dVar8,dVar9,pos.Z,false);
  AActor::SetXYZ(origin,&local_e0);
  AActor::PosPlusZ(&local_f8,origin,32.0);
  angle.Degrees = (double)P_SpawnMissileXYZ(&local_f8,origin,pAVar6,type,false,(AActor *)0x0);
  AActor::SetXYZ(origin,(DVector3 *)local_c8);
LAB_0050dd4c:
  if (angle.Degrees != 0.0) {
    if ((Pitch.Degrees._4_4_ & 0x30) == 0) {
      local_138 = AActor::VelXYToSpeed(angle.Degrees);
    }
    else {
      if ((Pitch.Degrees._4_4_ & 0x20) != 0) {
        TVector3<double>::Pitch((TVector3<double> *)&stack0xfffffffffffffec0);
        TAngle<double>::operator+=
                  ((TAngle<double> *)&stack0xffffffffffffff98,
                   (TAngle<double> *)&stack0xfffffffffffffec0);
      }
      dVar8 = TAngle<double>::Cos((TAngle<double> *)&stack0xffffffffffffff98);
      local_138 = ABS(dVar8 * *(double *)((long)angle.Degrees + 0xe0));
      dVar8 = TAngle<double>::Sin((TAngle<double> *)&stack0xffffffffffffff98);
      *(double *)((long)angle.Degrees + 0xd8) = dVar8 * *(double *)((long)angle.Degrees + 0xe0);
      if ((Pitch.Degrees._4_4_ & 0x100) == 0) {
        *(double *)((long)angle.Degrees + 0xd8) = *(double *)((long)angle.Degrees + 0xd8) * -1.0;
      }
    }
    if ((Pitch.Degrees._4_4_ & 0x40) != 0) {
      TAngle<double>::operator=
                ((TAngle<double> *)((long)angle.Degrees + 0xa8),
                 (TAngle<double> *)&stack0xffffffffffffff98);
    }
    if ((Pitch.Degrees._4_4_ & 0x80) == 0) {
      other = (TAngle<double> *)((long)angle.Degrees + 0xb0);
      TAngle<double>::TAngle((TAngle<double> *)&owner,(TAngle<double> *)&stack0xffffffffffffffa8);
      TAngle<double>::operator+(&local_148,other);
    }
    else {
      TAngle<double>::TAngle(&local_148,(TAngle<double> *)&stack0xffffffffffffffa8);
    }
    TAngle<double>::operator=((TAngle<double> *)((long)angle.Degrees + 0xb0),&local_148);
    AActor::VelFromAngle((AActor *)angle.Degrees,local_138);
    bVar7 = AActor::isMissile(origin,(Pitch.Degrees._4_4_ & 4) != 0);
    pAVar6 = origin;
    if (bVar7) {
      while( true ) {
        local_158 = pAVar6;
        bVar3 = AActor::isMissile(local_158,(Pitch.Degrees._4_4_ & 4) != 0);
        bVar7 = false;
        if (bVar3) {
          pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_158->target);
          bVar7 = pAVar6 != (AActor *)0x0;
        }
        if (!bVar7) break;
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_158->target);
      }
      TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)angle.Degrees + 0x208),local_158);
      TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_164,(Self *)((long)angle.Degrees + 0x1c0));
      TFlags<ActorFlag2,_unsigned_int>::operator&(&local_160,&origin->flags2);
      TFlags<ActorFlag2,_unsigned_int>::operator&(&local_15c,(ActorFlag2)&local_160);
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_15c);
      if (uVar4 != 0) {
        *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)((long)angle.Degrees + 0x278) =
             (origin->tracer).field_0;
      }
    }
    else {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_168,SUB84(angle.Degrees,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_168);
      if (uVar4 != 0) {
        *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)((long)angle.Degrees + 0x278) =
             (origin->target).field_0;
      }
    }
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_16c,
               SUB84(angle.Degrees,0) +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_16c);
    if (uVar4 != 0) {
      bVar7 = TObjPtr<AActor>::operator!=
                        ((TObjPtr<AActor> *)((long)angle.Degrees + 0x208),(AActor *)0x0);
      DVar1 = angle;
      if (bVar7) {
        pAVar6 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)((long)angle.Degrees + 0x208));
        AActor::SetFriendPlayer((AActor *)DVar1.Degrees,pAVar6->player);
      }
      else {
        *(undefined1 *)((long)angle.Degrees + 0x3be) = 0;
      }
    }
    P_CheckMissileSpawn((AActor *)angle.Degrees,origin->radius);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnProjectile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT_DEF	(Spawnheight);
	PARAM_FLOAT_DEF	(Spawnofs_xy);
	PARAM_ANGLE_DEF	(Angle);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(Pitch);
	PARAM_INT_DEF	(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	int aimmode = flags & CMF_AIMMODE;

	AActor * targ;
	AActor * missile;

	if (ref != NULL || aimmode == 2)
	{
		if (ti) 
		{
			DAngle angle = self->Angles.Yaw - 90;
			double x = Spawnofs_xy * angle.Cos();
			double y = Spawnofs_xy * angle.Sin();
			double z = Spawnheight + self->GetBobOffset() - 32 + (self->player? self->player->crouchoffset : 0.);

			DVector3 pos = self->Pos();
			switch (aimmode)
			{
			case 0:
			default:
				// same adjustment as above (in all 3 directions this time) - for better aiming!
				self->SetXYZ(self->Vec3Offset(x, y, z));
				missile = P_SpawnMissileXYZ(self->PosPlusZ(32.), self, ref, ti, false);
				self->SetXYZ(pos);
				break;

			case 1:
				missile = P_SpawnMissileXYZ(self->Vec3Offset(x, y, self->GetBobOffset() + Spawnheight), self, ref, ti, false);
				break;

			case 2:
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				missile = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, ti, self->Angles.Yaw, 0, GetDefaultByType(ti)->Speed, self, false);
				self->SetXYZ(pos);

				flags |= CMF_ABSOLUTEPITCH;

				break;
			}

			if (missile != NULL)
			{
				// Use the actual velocity instead of the missile's Speed property
				// so that this can handle missiles with a high vertical velocity 
				// component properly.

				double missilespeed;

				if ( (CMF_ABSOLUTEPITCH|CMF_OFFSETPITCH) & flags)
				{
					if (CMF_OFFSETPITCH & flags)
					{
						Pitch += missile->Vel.Pitch();
					}
					missilespeed = fabs(Pitch.Cos() * missile->Speed);
					missile->Vel.Z = Pitch.Sin() * missile->Speed;
					if (!(flags & CMF_BADPITCH)) missile->Vel.Z *= -1;
				}
				else
				{
					missilespeed = missile->VelXYToSpeed();
				}

				if (CMF_SAVEPITCH & flags)
				{
					missile->Angles.Pitch = Pitch;
					// In aimmode 0 and 1 without absolutepitch or offsetpitch, the pitch parameter
					// contains the unapplied parameter. In that case, it is set as pitch without
					// otherwise affecting the spawned actor.
				}

				missile->Angles.Yaw = (CMF_ABSOLUTEANGLE & flags) ? Angle : missile->Angles.Yaw + Angle;
				missile->VelFromAngle(missilespeed);
	
				// handle projectile shooting projectiles - track the
				// links back to a real owner
                if (self->isMissile(!!(flags & CMF_TRACKOWNER)))
                {
                	AActor *owner = self ;//->target;
                	while (owner->isMissile(!!(flags & CMF_TRACKOWNER)) && owner->target)
						owner = owner->target;
                	targ = owner;
                	missile->target = owner;
					// automatic handling of seeker missiles
					if (self->flags2 & missile->flags2 & MF2_SEEKERMISSILE)
					{
						missile->tracer = self->tracer;
					}
                }
				else if (missile->flags2 & MF2_SEEKERMISSILE)
				{
					// automatic handling of seeker missiles
					missile->tracer = self->target;
				}
				// we must redo the spectral check here because the owner is set after spawning so the FriendPlayer value may be wrong
				if (missile->flags4 & MF4_SPECTRAL)
				{
					if (missile->target != NULL)
					{
						missile->SetFriendPlayer(missile->target->player);
					}
					else
					{
						missile->FriendPlayer = 0;
					}
				}
				P_CheckMissileSpawn(missile, self->radius);
			}
		}
	}
	else if (flags & CMF_CHECKTARGETDEAD)
	{
		// Target is dead and the attack shall be aborted.
		if (self->SeeState != NULL && (self->health > 0 || !(self->flags3 & MF3_ISMONSTER)))
			self->SetState(self->SeeState);
	}
	return 0;
}